

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastsin.cpp
# Opt level: O1

double __thiscall FFastTrig::sin(FFastTrig *this,double __x)

{
  uint in_ESI;
  double dVar1;
  
  dVar1 = (double)(*(code *)(&DAT_00632d50 +
                            *(int *)(&DAT_00632d50 + (ulong)(in_ESI >> 0x1e ^ 2) * 4)))();
  return dVar1;
}

Assistant:

double FFastTrig::sin(unsigned bangle)
{
	switch (bangle & 0xc0000000)
	{
	default:
		return sinq1(bangle);

	case 0x40000000:
		return sinq1(0x80000000 - bangle);

	case 0x80000000:
		return -sinq1(bangle - 0x80000000);

	case 0xc0000000:
		return -sinq1(0 - bangle);
	}
}